

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Checks.h
# Opt level: O0

void UnitTest::CheckClose<double,double,double>
               (TestResults *results,double *expected,double *actual,double *tolerance,
               TestDetails *details)

{
  undefined8 test;
  bool bVar1;
  ostream *poVar2;
  char *failure;
  undefined1 local_1c8 [8];
  MemoryOutStream stream;
  TestDetails *details_local;
  double *tolerance_local;
  double *actual_local;
  double *expected_local;
  TestResults *results_local;
  
  stream._400_8_ = details;
  bVar1 = AreClose<double,double,double>(expected,actual,tolerance);
  if (!bVar1) {
    MemoryOutStream::MemoryOutStream((MemoryOutStream *)local_1c8);
    poVar2 = std::operator<<((ostream *)local_1c8,"Expected ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*expected);
    poVar2 = std::operator<<(poVar2," +/- ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*tolerance);
    poVar2 = std::operator<<(poVar2," but was ");
    std::ostream::operator<<(poVar2,*actual);
    test = stream._400_8_;
    failure = MemoryOutStream::GetText((MemoryOutStream *)local_1c8);
    TestResults::OnTestFailure(results,(TestDetails *)test,failure);
    MemoryOutStream::~MemoryOutStream((MemoryOutStream *)local_1c8);
  }
  return;
}

Assistant:

void CheckClose(TestResults& results, Expected const& expected, Actual const& actual, Tolerance const& tolerance,
                TestDetails const& details)
{
    if (!AreClose(expected, actual, tolerance))
    { 
        UnitTest::MemoryOutStream stream;
        stream << "Expected " << expected << " +/- " << tolerance << " but was " << actual;

        results.OnTestFailure(details, stream.GetText());
    }
}